

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitPropLoadThis
          (ByteCodeGenerator *this,RegSlot lhsLocation,ParseNodeSpecialName *pnodeSpecialName,
          FuncInfo *funcInfo,bool chkUndecl)

{
  Symbol *this_00;
  bool bVar1;
  ByteCodeWriter *pBVar2;
  Symbol *sym;
  bool chkUndecl_local;
  FuncInfo *funcInfo_local;
  ParseNodeSpecialName *pnodeSpecialName_local;
  RegSlot lhsLocation_local;
  ByteCodeGenerator *this_local;
  
  this_00 = (pnodeSpecialName->super_ParseNodeName).sym;
  if ((this_00 == (Symbol *)0x0) && (bVar1 = ShouldLoadConstThis(this,funcInfo), bVar1)) {
    pBVar2 = Writer(this);
    Js::ByteCodeWriter::Reg2(pBVar2,Ld_A,lhsLocation,funcInfo->thisConstantRegister);
  }
  else {
    EmitPropLoad(this,lhsLocation,(pnodeSpecialName->super_ParseNodeName).sym,
                 (pnodeSpecialName->super_ParseNodeName).pid,funcInfo,true);
    if (((this_00 == (Symbol *)0x0) || (bVar1 = Symbol::GetNeedDeclaration(this_00), bVar1)) &&
       (chkUndecl)) {
      pBVar2 = Writer(this);
      Js::ByteCodeWriter::Reg1(pBVar2,ChkUndecl,lhsLocation);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropLoadThis(Js::RegSlot lhsLocation, ParseNodeSpecialName *pnodeSpecialName, FuncInfo *funcInfo, bool chkUndecl)
{
    Symbol* sym = pnodeSpecialName->sym;

    if (!sym && this->ShouldLoadConstThis(funcInfo))
    {
        this->Writer()->Reg2(Js::OpCode::Ld_A, lhsLocation, funcInfo->thisConstantRegister);
    }
    else
    {
        this->EmitPropLoad(lhsLocation, pnodeSpecialName->sym, pnodeSpecialName->pid, funcInfo, true);

        if ((!sym || sym->GetNeedDeclaration()) && chkUndecl)
        {
            this->Writer()->Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
}